

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall ON_Surface::IsSphere(ON_Surface *this,ON_Sphere *sphere,double tolerance)

{
  double dVar1;
  ON_3dPoint point;
  ON_3dPoint point_00;
  ON_3dPoint point_01;
  ON_3dPoint point_02;
  ON_3dPoint point_03;
  ON_3dPoint point_04;
  double dVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  ON_RevSurface *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool local_591;
  undefined4 local_538;
  undefined4 local_4f8;
  bool rc;
  ON_3dPoint local_4c0;
  double local_4a8;
  double dStack_4a0;
  double local_498;
  ON_3dPoint local_490;
  ON_3dPoint local_478;
  uint local_460;
  int local_45c;
  int jj;
  int j;
  int ii;
  int i;
  double *t;
  double *s;
  int sc1;
  int sc0;
  double v;
  double u;
  double dStack_420;
  double local_418;
  ON_3dPoint local_410;
  double local_3f8;
  double dStack_3f0;
  double local_3e8;
  ON_3dPoint local_3d8;
  ON_3dPoint local_3c0;
  double local_3a8;
  double dStack_3a0;
  double local_398;
  ON_3dPoint local_390;
  double local_378;
  double dStack_370;
  double local_368;
  ON_3dPoint local_358;
  ON_3dPoint local_340;
  double local_328;
  double d;
  double a;
  ON_3dPoint S;
  ON_3dPoint P;
  double tol;
  double sph1tol;
  double sph0tol;
  undefined1 auStack_2c8 [7];
  bool bTestSphere1;
  ON_Sphere sph1;
  undefined1 auStack_238 [7];
  bool bTestSphere0;
  ON_Sphere sph0;
  undefined1 auStack_1a0 [4];
  int bIsArc1;
  ON_Arc arc1;
  undefined1 auStack_e0 [4];
  int bIsArc0;
  ON_Arc arc0;
  ON_Curve *crv;
  ON_RevSurface *rs;
  double tolerance_local;
  ON_Sphere *sphere_local;
  ON_Surface *this_local;
  long *plVar6;
  
  bVar3 = ON_IsValid(tolerance);
  if ((!bVar3) || (rs = (ON_RevSurface *)tolerance, tolerance <= 0.0)) {
    rs = (ON_RevSurface *)0x3df0000000000000;
  }
  this_00 = ON_RevSurface::Cast((ON_Object *)this);
  if (this_00 == (ON_RevSurface *)0x0) {
    (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,1);
    dVar1 = ON_Interval::Mid((ON_Interval *)(arc0.m_angle.m_t + 1));
    iVar5 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])
                      (SUB84(dVar1,0),this,0);
    plVar6 = (long *)CONCAT44(extraout_var,iVar5);
    if (plVar6 == (long *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      ON_Arc::ON_Arc((ON_Arc *)auStack_e0);
      local_4f8 = SUB84(rs,0);
      local_538 = local_4f8;
      if ((double)rs <= 2.3283064365386963e-10) {
        local_4f8 = 0;
      }
      bVar4 = (**(code **)(*plVar6 + 0x180))(local_4f8,plVar6,0,auStack_e0);
      if (plVar6 != (long *)0x0) {
        (**(code **)(*plVar6 + 0x20))();
      }
      if ((bVar4 & 1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,0);
        dVar1 = ON_Interval::Mid((ON_Interval *)(arc1.m_angle.m_t + 1));
        iVar5 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])
                          (SUB84(dVar1,0),this,1);
        plVar6 = (long *)CONCAT44(extraout_var_00,iVar5);
        if (plVar6 == (long *)0x0) {
          this_local._7_1_ = false;
        }
        else {
          ON_Arc::ON_Arc((ON_Arc *)auStack_1a0);
          if ((double)rs <= 2.3283064365386963e-10) {
            local_538 = 0;
          }
          bVar4 = (**(code **)(*plVar6 + 0x180))(local_538,plVar6,0,auStack_1a0);
          if (plVar6 != (long *)0x0) {
            (**(code **)(*plVar6 + 0x20))();
          }
          if ((bVar4 & 1) == 0) {
            this_local._7_1_ = false;
          }
          else {
            ON_Sphere::ON_Sphere((ON_Sphere *)auStack_238);
            sph0.plane.plane_equation.y = arc0.super_ON_Circle.plane.plane_equation.y;
            sph0.plane.plane_equation.z = arc0.super_ON_Circle.plane.plane_equation.z;
            sph0.plane.zaxis.z = arc0.super_ON_Circle.plane.zaxis.z;
            sph0.plane.plane_equation.x = arc0.super_ON_Circle.plane.plane_equation.x;
            sph0.plane.zaxis.x = arc0.super_ON_Circle.plane.zaxis.x;
            sph0.plane.zaxis.y = arc0.super_ON_Circle.plane.zaxis.y;
            sph0.plane.yaxis.y = arc0.super_ON_Circle.plane.yaxis.y;
            sph0.plane.yaxis.z = arc0.super_ON_Circle.plane.yaxis.z;
            sph0.plane.xaxis.z = arc0.super_ON_Circle.plane.xaxis.z;
            sph0.plane.yaxis.x = arc0.super_ON_Circle.plane.yaxis.x;
            sph0.plane.xaxis.x = arc0.super_ON_Circle.plane.xaxis.x;
            sph0.plane.xaxis.y = arc0.super_ON_Circle.plane.xaxis.y;
            sph0.plane.origin.y = arc0.super_ON_Circle.plane.origin.y;
            sph0.plane.origin.z = arc0.super_ON_Circle.plane.origin.z;
            _auStack_238 = _auStack_e0;
            sph0.plane.origin.x = arc0.super_ON_Circle.plane.origin.x;
            sph0.plane.plane_equation.d = arc0.super_ON_Circle.plane.plane_equation.d;
            sph1.radius._7_1_ = ON_Sphere::IsValid((ON_Sphere *)auStack_238);
            ON_Sphere::ON_Sphere((ON_Sphere *)auStack_2c8);
            sph1.plane.plane_equation.y = arc1.super_ON_Circle.plane.plane_equation.y;
            sph1.plane.plane_equation.z = arc1.super_ON_Circle.plane.plane_equation.z;
            sph1.plane.zaxis.z = arc1.super_ON_Circle.plane.zaxis.z;
            sph1.plane.plane_equation.x = arc1.super_ON_Circle.plane.plane_equation.x;
            sph1.plane.zaxis.x = arc1.super_ON_Circle.plane.zaxis.x;
            sph1.plane.zaxis.y = arc1.super_ON_Circle.plane.zaxis.y;
            sph1.plane.yaxis.y = arc1.super_ON_Circle.plane.yaxis.y;
            sph1.plane.yaxis.z = arc1.super_ON_Circle.plane.yaxis.z;
            sph1.plane.xaxis.z = arc1.super_ON_Circle.plane.xaxis.z;
            sph1.plane.yaxis.x = arc1.super_ON_Circle.plane.yaxis.x;
            sph1.plane.xaxis.x = arc1.super_ON_Circle.plane.xaxis.x;
            sph1.plane.xaxis.y = arc1.super_ON_Circle.plane.xaxis.y;
            sph1.plane.origin.y = arc1.super_ON_Circle.plane.origin.y;
            sph1.plane.origin.z = arc1.super_ON_Circle.plane.origin.z;
            _auStack_2c8 = _auStack_1a0;
            sph1.plane.origin.x = arc1.super_ON_Circle.plane.origin.x;
            sph1.plane.plane_equation.d = arc1.super_ON_Circle.plane.plane_equation.d;
            sph0tol._7_1_ = ON_Sphere::IsValid((ON_Sphere *)auStack_2c8);
            if (((sph1.radius._7_1_ & 1) != 0) || (sph0tol._7_1_)) {
              sph1tol = 0.0;
              tol = 0.0;
              P.z = (arc0.super_ON_Circle.plane.plane_equation.d +
                    arc1.super_ON_Circle.plane.plane_equation.d) * 7.450580596925e-09;
              for (d = 0.0; d < 1.0; d = d + 0.25) {
                ON_Circle::PointAt(&local_340,(ON_Circle *)auStack_e0,(d + d) * 3.141592653589793);
                dVar2 = local_340.z;
                dVar1 = local_340.y;
                S.z = local_340.x;
                if ((sph1.radius._7_1_ & 1) != 0) {
                  local_368 = local_340.z;
                  local_378 = local_340.x;
                  dStack_370 = local_340.y;
                  point.y = local_340.y;
                  point.x = local_340.x;
                  point.z = local_340.z;
                  ON_Sphere::ClosestPointTo(&local_358,(ON_Sphere *)auStack_238,point);
                  S.y = local_358.z;
                  a = local_358.x;
                  S.x = local_358.y;
                  local_328 = ON_3dPoint::DistanceTo((ON_3dPoint *)&a,(ON_3dPoint *)&S.z);
                  if (local_328 <= P.z) {
                    if (sph1tol < local_328) {
                      sph1tol = local_328;
                    }
                  }
                  else {
                    sph1.radius._7_1_ = 0;
                    if (sph0tol._7_1_ == false) {
                      this_local._7_1_ = false;
                      goto LAB_008284cf;
                    }
                  }
                }
                if (sph0tol._7_1_ != false) {
                  local_398 = dVar2;
                  local_3a8 = S.z;
                  dStack_3a0 = dVar1;
                  point_00.y = dVar1;
                  point_00.x = S.z;
                  point_00.z = dVar2;
                  ON_Sphere::ClosestPointTo(&local_390,(ON_Sphere *)auStack_2c8,point_00);
                  S.y = local_390.z;
                  a = local_390.x;
                  S.x = local_390.y;
                  local_328 = ON_3dPoint::DistanceTo((ON_3dPoint *)&a,(ON_3dPoint *)&S.z);
                  if (local_328 <= P.z) {
                    if (tol < local_328) {
                      tol = local_328;
                    }
                  }
                  else {
                    sph0tol._7_1_ = false;
                    if ((sph1.radius._7_1_ & 1) == 0) {
                      this_local._7_1_ = false;
                      goto LAB_008284cf;
                    }
                  }
                }
                ON_Circle::PointAt(&local_3c0,(ON_Circle *)auStack_1a0,(d + d) * 3.141592653589793);
                dVar2 = local_3c0.z;
                dVar1 = local_3c0.y;
                S.z = local_3c0.x;
                if ((sph1.radius._7_1_ & 1) != 0) {
                  local_3e8 = local_3c0.z;
                  local_3f8 = local_3c0.x;
                  dStack_3f0 = local_3c0.y;
                  point_01.y = local_3c0.y;
                  point_01.x = local_3c0.x;
                  point_01.z = local_3c0.z;
                  ON_Sphere::ClosestPointTo(&local_3d8,(ON_Sphere *)auStack_238,point_01);
                  S.y = local_3d8.z;
                  a = local_3d8.x;
                  S.x = local_3d8.y;
                  local_328 = ON_3dPoint::DistanceTo((ON_3dPoint *)&a,(ON_3dPoint *)&S.z);
                  if (local_328 <= P.z) {
                    if (sph1tol < local_328) {
                      sph1tol = local_328;
                    }
                  }
                  else {
                    sph1.radius._7_1_ = 0;
                    if (sph0tol._7_1_ == false) {
                      this_local._7_1_ = false;
                      goto LAB_008284cf;
                    }
                  }
                }
                if (sph0tol._7_1_ != false) {
                  local_418 = dVar2;
                  u = S.z;
                  dStack_420 = dVar1;
                  point_02.y = dVar1;
                  point_02.x = S.z;
                  point_02.z = dVar2;
                  ON_Sphere::ClosestPointTo(&local_410,(ON_Sphere *)auStack_2c8,point_02);
                  S.y = local_410.z;
                  a = local_410.x;
                  S.x = local_410.y;
                  local_328 = ON_3dPoint::DistanceTo((ON_3dPoint *)&a,(ON_3dPoint *)&S.z);
                  if (local_328 <= P.z) {
                    if (tol < local_328) {
                      tol = local_328;
                    }
                  }
                  else {
                    sph0tol._7_1_ = false;
                    if ((sph1.radius._7_1_ & 1) == 0) {
                      this_local._7_1_ = false;
                      goto LAB_008284cf;
                    }
                  }
                }
              }
              if (((sph1.radius._7_1_ & 1) == 0) && (sph0tol._7_1_ == false)) {
                this_local._7_1_ = false;
              }
              else {
                if (P.z < (double)rs) {
                  P.z = (double)rs;
                }
                s._4_4_ = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,0)
                ;
                s._0_4_ = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,1)
                ;
                t = (double *)onmalloc((long)(s._4_4_ + (int)s) * 8 + 0x10);
                _ii = t + (long)s._4_4_ + 1;
                (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,0,t);
                (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,1,_ii);
                for (j = 0; j < s._4_4_; j = j + 1) {
                  for (jj = (int)(j != 0); jj < 5; jj = jj + 1) {
                    v = ((double)(4 - jj) * t[j] + (double)jj * t[j + 1]) * 0.25;
                    for (local_45c = 0; local_45c <= (int)s; local_45c = local_45c + 1) {
                      for (local_460 = (uint)(local_45c != 0); (int)local_460 < 5;
                          local_460 = local_460 + 1) {
                        _sc1 = ((double)(int)(4 - local_460) * _ii[local_45c] +
                               (double)(int)local_460 * _ii[(long)local_45c + 1]) * 0.25;
                        PointAt(&local_478,this,v,_sc1);
                        dVar2 = local_478.z;
                        dVar1 = local_478.y;
                        S.z = local_478.x;
                        if ((sph1.radius._7_1_ & 1) != 0) {
                          local_498 = local_478.z;
                          local_4a8 = local_478.x;
                          dStack_4a0 = local_478.y;
                          point_03.y = local_478.y;
                          point_03.x = local_478.x;
                          point_03.z = local_478.z;
                          ON_Sphere::ClosestPointTo(&local_490,(ON_Sphere *)auStack_238,point_03);
                          S.y = local_490.z;
                          a = local_490.x;
                          S.x = local_490.y;
                          local_328 = ON_3dPoint::DistanceTo((ON_3dPoint *)&a,(ON_3dPoint *)&S.z);
                          if (local_328 <= P.z) {
                            if (sph1tol < local_328) {
                              sph1tol = local_328;
                            }
                          }
                          else {
                            sph1.radius._7_1_ = 0;
                            if (sph0tol._7_1_ == false) {
                              onfree(t);
                              this_local._7_1_ = false;
                              goto LAB_008284cf;
                            }
                          }
                        }
                        if (sph0tol._7_1_ != false) {
                          point_04.y = dVar1;
                          point_04.x = S.z;
                          point_04.z = dVar2;
                          ON_Sphere::ClosestPointTo(&local_4c0,(ON_Sphere *)auStack_2c8,point_04);
                          S.y = local_4c0.z;
                          a = local_4c0.x;
                          S.x = local_4c0.y;
                          local_328 = ON_3dPoint::DistanceTo((ON_3dPoint *)&a,(ON_3dPoint *)&S.z);
                          if (local_328 <= P.z) {
                            if (tol < local_328) {
                              tol = local_328;
                            }
                          }
                          else {
                            sph0tol._7_1_ = false;
                            if ((sph1.radius._7_1_ & 1) == 0) {
                              onfree(t);
                              this_local._7_1_ = false;
                              goto LAB_008284cf;
                            }
                          }
                        }
                      }
                    }
                  }
                }
                onfree(t);
                local_591 = true;
                if ((sph1.radius._7_1_ & 1) == 0) {
                  local_591 = sph0tol._7_1_;
                }
                this_local._7_1_ = local_591;
                if ((local_591 != false) && (sphere != (ON_Sphere *)0x0)) {
                  if ((sph1.radius._7_1_ & 1) == 0) {
                    memcpy(sphere,auStack_2c8,0x88);
                  }
                  else if (sph0tol._7_1_ == false) {
                    memcpy(sphere,auStack_238,0x88);
                  }
                  else if (tol < sph1tol) {
                    memcpy(sphere,auStack_2c8,0x88);
                  }
                  else {
                    memcpy(sphere,auStack_238,0x88);
                  }
                }
              }
            }
            else {
              this_local._7_1_ = false;
            }
LAB_008284cf:
            ON_Sphere::~ON_Sphere((ON_Sphere *)auStack_2c8);
            ON_Sphere::~ON_Sphere((ON_Sphere *)auStack_238);
          }
          ON_Arc::~ON_Arc((ON_Arc *)auStack_1a0);
        }
      }
      ON_Arc::~ON_Arc((ON_Arc *)auStack_e0);
    }
  }
  else {
    bVar3 = ON_RevSurface::IsSpherical(this_00,sphere,(double)rs);
    this_local._7_1_ = (bool)(-bVar3 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Surface::IsSphere( ON_Sphere* sphere, double tolerance ) const
{
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;
  const ON_RevSurface* rs = ON_RevSurface::Cast(this);
  if (rs)
  {
    return rs->IsSpherical(sphere,tolerance) ? true : false;
  }

  ON_Curve* crv = IsoCurve(0,Domain(1).Mid());
  if ( !crv )
    return false;

  ON_Arc arc0;
  int bIsArc0 = crv->IsArc(0,&arc0,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  delete crv;
  crv = 0;
  if ( !bIsArc0 )
    return false;

  crv = IsoCurve(1,Domain(0).Mid());
  if ( !crv )
    return false;
  ON_Arc arc1;
  int bIsArc1 = crv->IsArc(0,&arc1,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  delete crv;
  crv = 0;
  if ( !bIsArc1 )
    return false;

  // Determine if one of these arcs is a a portion of a 
  // great circle.

  ON_Sphere sph0;
  sph0.plane = arc0.plane;
  sph0.radius = arc0.radius;
  bool bTestSphere0 = sph0.IsValid();

  ON_Sphere sph1;
  sph1.plane = arc1.plane;
  sph1.radius = arc1.radius;
  bool bTestSphere1 = sph1.IsValid();

  if ( !bTestSphere0 && !bTestSphere1 )
    return false;

  double sph0tol = 0.0;
  double sph1tol = 0.0;

  double tol = 0.5*ON_SQRT_EPSILON*(arc0.radius+arc1.radius);

  ON_3dPoint P, S;
  double a, d;
  for ( a = 0.0; a < 1.0; a += 0.25 )
  {
    P = arc0.PointAt(a*2.0*ON_PI);
    if ( bTestSphere0 )
    {
      S = sph0.ClosestPointTo(P);
      d = S.DistanceTo(P);
      if ( d > tol )
      {
        bTestSphere0 = false;
        if ( !bTestSphere1 )
          return false;
      }
      else if ( d > sph0tol )
        sph0tol = d;
    }
    if ( bTestSphere1 )
    {
      S = sph1.ClosestPointTo(P);
      d = S.DistanceTo(P);
      if ( d > tol )
      {
        bTestSphere1 = false;
        if ( !bTestSphere0 )
          return false;
      }
      else if ( d > sph1tol )
        sph1tol = d;
    }

    P = arc1.PointAt(a*2.0*ON_PI);
    if ( bTestSphere0 )
    {
      S = sph0.ClosestPointTo(P);
      d = S.DistanceTo(P);
      if ( d > tol )
      {
        bTestSphere0 = false;
        if ( !bTestSphere1 )
          return false;
      }
      else if ( d > sph0tol )
        sph0tol = d;
    }
    if ( bTestSphere1 )
    {
      S = sph1.ClosestPointTo(P);
      d = S.DistanceTo(P);
      if ( d > tol )
      {
        bTestSphere1 = false;
        if ( !bTestSphere0 )
          return false;
      }
      else if ( d > sph1tol )
        sph1tol = d;
    }
  }
  // If the arc's are both great circles, then
  // both will be true unless we have a bug or
  // numerical issues.
  if (!bTestSphere0 && !bTestSphere1)
    return false;

  if ( tol < tolerance )
    tol = tolerance;

  double u, v;
  int sc0 = SpanCount(0);
  int sc1 = SpanCount(1);
  double* s = (double*)onmalloc( (sc0+sc1+2)*sizeof(s[0]) );
  double* t = s + (sc0+1);
  GetSpanVector(0,s);
  GetSpanVector(1,t);
  for ( int i = 0; i < sc0; i++ )
  {
    for ( int ii = i?1:0; ii <= 4; ii++ )
    {
      u = 0.25*((4-ii)*s[i] + ii*s[i+1]);
      for ( int j = 0; j <= sc1; j++ )
      {
        for ( int jj = j?1:0; jj <= 4; jj++ )
        {
          v = 0.25*((4-jj)*t[j] + jj*t[j+1]);
          P = PointAt(u,v);
          if ( bTestSphere0 )
          {
            S = sph0.ClosestPointTo(P);
            d = S.DistanceTo(P);
            if ( d > tol )
            {
              bTestSphere0 = false;
              if ( !bTestSphere1 )
              {
                onfree(s);
                return false;
              }
            }
            else if ( d > sph0tol )
              sph0tol = d;
          }
          if ( bTestSphere1 )
          {
            S = sph1.ClosestPointTo(P);
            d = S.DistanceTo(P);
            if ( d > tol )
            {
              bTestSphere1 = false;
              if ( !bTestSphere0 )
              {
                onfree(s);
                return false;
              }
            }
            else if ( d > sph1tol )
              sph1tol = d;
          }
        }
      }
    }
  }
  onfree(s);

  bool rc = (bTestSphere0 || bTestSphere1);
  if ( rc && sphere )
  {
    if (!bTestSphere0)
      *sphere = sph1;
    else if (!bTestSphere1)
      *sphere = sph0;
    else if (sph0tol <= sph1tol)
      *sphere = sph0;
    else
      *sphere = sph1;
  }

  return rc;
}